

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O1

double sisl::basis_function::convolution_sum_deriv_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                 (vector *p,cartesian_cubic<float> *lattice,int *component,double *h)

{
  int iVar1;
  undefined4 extraout_var;
  char *__function;
  DenseStorage<int,__1,__1,_1,_0> *other;
  lattice_site c;
  lattice_site s;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  lattice_site extent;
  vector local_e0;
  double local_d0;
  void *local_c8 [2];
  DenseStorage<int,__1,__1,_1,_0> local_b8;
  double local_a8;
  int *local_a0;
  vector *local_98;
  vector *local_90;
  DenseStorage<int,__1,__1,_1,_0> *local_88;
  vector *local_80;
  DenseStorage<int,__1,__1,_1,_0> *local_78;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  local_58;
  void *local_40 [2];
  
  local_a0 = component;
  tp_linear::get_integer_support<3>();
  local_98 = p;
  (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0xe])(&local_e0,lattice,p);
  (*(lattice->super_base_lattice<float>)._vptr_base_lattice[10])(local_40,lattice);
  if (local_58.
      super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d0 = 0.0;
  }
  else {
    local_d0 = 0.0;
    other = (DenseStorage<int,__1,__1,_1,_0> *)
            local_58.
            super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage(&local_b8,other);
      local_90 = &local_e0;
      local_88 = &local_b8;
      if (local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != local_b8.m_rows) {
LAB_00110bcb:
        __function = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<int>, Lhs = const Eigen::Matrix<int, -1, 1>, Rhs = const Eigen::Matrix<int, -1, 1>]"
        ;
LAB_00110be0:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
      }
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_c8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_90);
      iVar1 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0x11])
                        (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_c8);
      free(local_c8[0]);
      if ((char)iVar1 != '\0') {
        local_90 = &local_e0;
        local_88 = &local_b8;
        if (local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != local_b8.m_rows) goto LAB_00110bcb;
        Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_c8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                    *)&local_90);
        iVar1 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0x14])
                          (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_c8);
        free(local_c8[0]);
        if ((char)iVar1 != '\0') {
          if (local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != local_b8.m_rows) goto LAB_00110bcb;
          local_90 = local_98;
          local_80 = &local_e0;
          local_78 = &local_b8;
          if ((local_98->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows != local_b8.m_rows) {
            __function = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int, double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int, double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>>]"
            ;
            goto LAB_00110be0;
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_c8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                      *)&local_90);
          local_a8 = tp_linear::dphi<3>((vector *)local_c8,local_a0);
          free(local_c8[0]);
          if ((local_a8 != 0.0) || (NAN(local_a8))) {
            local_90 = &local_e0;
            local_88 = &local_b8;
            if (local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != local_b8.m_rows) goto LAB_00110bcb;
            Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                      ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_c8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                        *)&local_90);
            iVar1 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[5])
                              (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_c8);
            local_d0 = local_d0 + local_a8 * (double)*(float *)CONCAT44(extraout_var,iVar1);
            free(local_c8[0]);
          }
        }
      }
      free(local_b8.m_data);
      other = other + 1;
    } while (other != (DenseStorage<int,__1,__1,_1,_0> *)
                      local_58.
                      super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  free(local_40[0]);
  free(local_e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_58);
  return local_d0;
}

Assistant:

static double convolution_sum_deriv_h(const vector &p, const L *lattice, const int &component, const double &h) {

            auto sites = BF::template get_integer_support<N>();
            lattice_site c = lattice->get_nearest_site(p);
            lattice_site extent = lattice->get_dimensions();
            double value = 0;

            for(lattice_site s : sites) {
                if(!lattice->is_lattice_site(c+s)) continue;
                if(!lattice->is_filled(c+s)) continue;

                double w = BF::template dphi<N>(h, p - (c+s).cast<double>(), component);
                if(w == 0.) continue;
                value += w * (*lattice)(c + s);
            }
            return value;
        }